

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edition_unittest.pb.cc
# Opt level: O0

size_t __thiscall edition_unittest::TestDeprecatedFields::ByteSizeLong(TestDeprecatedFields *this)

{
  uint uVar1;
  int iVar2;
  int32_t iVar3;
  OneofFieldsCase OVar4;
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *pRVar5;
  const_reference value;
  size_t sVar6;
  uint32_t *puVar7;
  int local_60;
  int n;
  int i;
  uint32_t cached_has_bits;
  size_t total_size;
  TestDeprecatedFields *this_;
  TestDeprecatedFields *this_local;
  ulong local_38;
  size_t line;
  void *prefetch_ptr;
  ptrdiff_t offset;
  
  for (local_38 = 0; local_38 < 5; local_38 = local_38 + 1) {
  }
  pRVar5 = _internal_deprecated_repeated_string_abi_cxx11_(this);
  iVar2 = google::protobuf::
          RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::size(pRVar5);
  _i = google::protobuf::internal::FromIntSize(iVar2);
  local_60 = 0;
  pRVar5 = _internal_deprecated_repeated_string_abi_cxx11_(this);
  iVar2 = google::protobuf::
          RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::size(pRVar5);
  for (; local_60 < iVar2; local_60 = local_60 + 1) {
    pRVar5 = _internal_deprecated_repeated_string_abi_cxx11_(this);
    value = google::protobuf::
            RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::Get(pRVar5,local_60);
    sVar6 = google::protobuf::internal::WireFormatLite::StringSize(value);
    _i = sVar6 + _i;
  }
  puVar7 = google::protobuf::internal::HasBits<1>::operator[](&(this->field_0)._impl_._has_bits_,0);
  uVar1 = *puVar7;
  if ((uVar1 & 7) != 0) {
    if ((uVar1 & 1) != 0) {
      sVar6 = google::protobuf::internal::WireFormatLite::
              MessageSize<edition_unittest::TestAllTypes_NestedMessage>
                        ((this->field_0)._impl_.deprecated_message_);
      _i = sVar6 + 1 + _i;
    }
    if ((uVar1 & 2) != 0) {
      sVar6 = google::protobuf::internal::WireFormatLite::
              MessageSize<edition_unittest::TestDeprecatedFields>((this->field_0)._impl_.nested_);
      _i = sVar6 + 1 + _i;
    }
    if ((uVar1 & 4) != 0) {
      iVar3 = _internal_deprecated_int32(this);
      sVar6 = google::protobuf::internal::WireFormatLite::Int32SizePlusOne(iVar3);
      _i = sVar6 + _i;
    }
  }
  OVar4 = oneof_fields_case(this);
  if ((OVar4 != ONEOF_FIELDS_NOT_SET) && (OVar4 == kDeprecatedInt32InOneof)) {
    iVar3 = _internal_deprecated_int32_in_oneof(this);
    sVar6 = google::protobuf::internal::WireFormatLite::Int32SizePlusOne(iVar3);
    _i = sVar6 + _i;
  }
  sVar6 = google::protobuf::Message::MaybeComputeUnknownFieldsSize
                    (&this->super_Message,_i,&(this->field_0)._impl_._cached_size_);
  return sVar6;
}

Assistant:

::size_t TestDeprecatedFields::ByteSizeLong() const {
  const TestDeprecatedFields& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(message_byte_size_start:edition_unittest.TestDeprecatedFields)
  ::size_t total_size = 0;

  ::uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void)cached_has_bits;

  ::_pbi::Prefetch5LinesFrom7Lines(&this_);
   {
    // repeated string deprecated_repeated_string = 4 [deprecated = true];
    {
      total_size +=
          1 * ::google::protobuf::internal::FromIntSize(this_._internal_deprecated_repeated_string().size());
      for (int i = 0, n = this_._internal_deprecated_repeated_string().size(); i < n; ++i) {
        total_size += ::google::protobuf::internal::WireFormatLite::StringSize(
            this_._internal_deprecated_repeated_string().Get(i));
      }
    }
  }
  cached_has_bits = this_._impl_._has_bits_[0];
  if ((cached_has_bits & 0x00000007u) != 0) {
    // .edition_unittest.TestAllTypes.NestedMessage deprecated_message = 3 [deprecated = true];
    if ((cached_has_bits & 0x00000001u) != 0) {
      total_size += 1 +
                    ::google::protobuf::internal::WireFormatLite::MessageSize(*this_._impl_.deprecated_message_);
    }
    // .edition_unittest.TestDeprecatedFields nested = 5;
    if ((cached_has_bits & 0x00000002u) != 0) {
      total_size += 1 +
                    ::google::protobuf::internal::WireFormatLite::MessageSize(*this_._impl_.nested_);
    }
    // int32 deprecated_int32 = 1 [deprecated = true];
    if ((cached_has_bits & 0x00000004u) != 0) {
      total_size += ::_pbi::WireFormatLite::Int32SizePlusOne(
          this_._internal_deprecated_int32());
    }
  }
  switch (this_.oneof_fields_case()) {
    // int32 deprecated_int32_in_oneof = 2 [deprecated = true];
    case kDeprecatedInt32InOneof: {
      total_size += ::_pbi::WireFormatLite::Int32SizePlusOne(
          this_._internal_deprecated_int32_in_oneof());
      break;
    }
    case ONEOF_FIELDS_NOT_SET: {
      break;
    }
  }
  return this_.MaybeComputeUnknownFieldsSize(total_size,
                                             &this_._impl_._cached_size_);
}